

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int eval_number(ly_ctx *ctx,lyxp_expr *exp,uint16_t *exp_idx,lyxp_set *set)

{
  ushort uVar1;
  ushort uVar2;
  long lVar3;
  lyxp_expr *ctx_00;
  int *piVar4;
  char *pcVar5;
  char *pcVar6;
  longdouble in_ST0;
  char *local_50;
  char *endptr;
  longdouble num;
  lyxp_set *local_30;
  lyxp_set *set_local;
  uint16_t *exp_idx_local;
  lyxp_expr *exp_local;
  ly_ctx *ctx_local;
  
  local_30 = set;
  set_local = (lyxp_set *)exp_idx;
  exp_idx_local = (uint16_t *)exp;
  exp_local = (lyxp_expr *)ctx;
  if (set != (lyxp_set *)0x0) {
    piVar4 = __errno_location();
    *piVar4 = 0;
    strtold((char *)(*(long *)(exp_idx_local + 0x14) +
                    (ulong)*(ushort *)
                            (*(long *)(exp_idx_local + 4) +
                            (ulong)(ushort)(short)set_local->type * 2)),&local_50);
    _endptr = in_ST0;
    piVar4 = __errno_location();
    if (*piVar4 != 0) {
      ly_vlog((ly_ctx *)exp_local,LYE_XPATH_INTOK,LY_VLOG_NONE,(void *)0x0,"Unknown",
              *(long *)(exp_idx_local + 0x14) +
              (ulong)*(ushort *)
                      (*(long *)(exp_idx_local + 4) + (ulong)(ushort)(short)set_local->type * 2));
      ctx_00 = exp_local;
      uVar1 = *(ushort *)(*(long *)(exp_idx_local + 8) + (ulong)(ushort)(short)set_local->type * 2);
      lVar3 = *(long *)(exp_idx_local + 0x14);
      uVar2 = *(ushort *)(*(long *)(exp_idx_local + 4) + (ulong)(ushort)(short)set_local->type * 2);
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      ly_vlog((ly_ctx *)ctx_00,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
              "Failed to convert \"%.*s\" into a long double (%s).",(ulong)uVar1,
              lVar3 + (ulong)uVar2,(short)pcVar5);
      return -1;
    }
    if ((long)local_50 -
        (*(long *)(exp_idx_local + 0x14) +
        (ulong)*(ushort *)(*(long *)(exp_idx_local + 4) + (ulong)(ushort)(short)set_local->type * 2)
        ) != (ulong)*(ushort *)
                     (*(long *)(exp_idx_local + 8) + (ulong)(ushort)(short)set_local->type * 2)) {
      ly_vlog((ly_ctx *)exp_local,LYE_XPATH_INTOK,LY_VLOG_NONE,(void *)0x0,"Unknown",
              *(long *)(exp_idx_local + 0x14) +
              (ulong)*(ushort *)
                      (*(long *)(exp_idx_local + 4) + (ulong)(ushort)(short)set_local->type * 2));
      ly_vlog((ly_ctx *)exp_local,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
              "Failed to convert \"%.*s\" into a long double.",
              (ulong)*(ushort *)
                      (*(long *)(exp_idx_local + 8) + (ulong)(ushort)(short)set_local->type * 2),
              *(long *)(exp_idx_local + 0x14) +
              (ulong)*(ushort *)
                      (*(long *)(exp_idx_local + 4) + (ulong)(ushort)(short)set_local->type * 2));
      return -1;
    }
    set_fill_number(local_30,_endptr);
  }
  pcVar5 = "skipped";
  if (local_30 != (lyxp_set *)0x0) {
    pcVar5 = "parsed";
  }
  pcVar6 = print_token(*(lyxp_token *)
                        (*(long *)exp_idx_local + (ulong)(ushort)(short)set_local->type * 4));
  ly_log_dbg(8,"%-27s %s %s[%u]","eval_number",pcVar5,pcVar6,
             (ulong)*(ushort *)
                     (*(long *)(exp_idx_local + 4) + (ulong)(ushort)(short)set_local->type * 2));
  *(undefined2 *)&set_local->type = (short)set_local->type + LYXP_SET_NODE_SET;
  return 0;
}

Assistant:

static int
eval_number(struct ly_ctx *ctx, struct lyxp_expr *exp, uint16_t *exp_idx, struct lyxp_set *set)
{
    long double num;
    char *endptr;

    if (set) {
        errno = 0;
        num = strtold(&exp->expr[exp->expr_pos[*exp_idx]], &endptr);
        if (errno) {
            LOGVAL(ctx, LYE_XPATH_INTOK, LY_VLOG_NONE, NULL, "Unknown", &exp->expr[exp->expr_pos[*exp_idx]]);
            LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "Failed to convert \"%.*s\" into a long double (%s).",
                   exp->tok_len[*exp_idx], &exp->expr[exp->expr_pos[*exp_idx]], strerror(errno));
            return -1;
        } else if (endptr - &exp->expr[exp->expr_pos[*exp_idx]] != exp->tok_len[*exp_idx]) {
            LOGVAL(ctx, LYE_XPATH_INTOK, LY_VLOG_NONE, NULL, "Unknown", &exp->expr[exp->expr_pos[*exp_idx]]);
            LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "Failed to convert \"%.*s\" into a long double.",
                   exp->tok_len[*exp_idx], &exp->expr[exp->expr_pos[*exp_idx]]);
            return -1;
        }

        set_fill_number(set, num);
    }

    LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
    ++(*exp_idx);
    return EXIT_SUCCESS;
}